

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModifiedPage.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PDFModifiedPage::WriteModifiedResourcesDict_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PDFModifiedPage *this,PDFParser *inParser,
          PDFDictionary *inResourcesDictionary,ObjectsContext *inObjectContext,
          PDFDocumentCopyingContext *inCopyingContext)

{
  uchar inCharCode;
  DictionaryContext *pDVar1;
  bool bVar2;
  ObjectsContext *this_00;
  PDFObject *inPDFObject;
  PDFDictionary *pPVar3;
  key_type pPVar4;
  string *psVar5;
  mapped_type pPVar6;
  ulong uVar7;
  uchar *puVar8;
  reference ppPVar9;
  ObjectIDType inObjectID;
  ObjectReference local_1a8;
  BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_> local_194;
  string local_190;
  undefined1 local_170 [8];
  string formObjectName;
  int local_144;
  iterator iStack_140;
  int i_1;
  iterator itForms;
  string name;
  unsigned_long i;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  itExisting;
  string imageObjectName;
  string local_d0;
  undefined1 local_b0 [8];
  PDFObjectCastPtr<PDFDictionary> existingXObjectDict;
  DictionaryContext *xobjectDict;
  string local_90;
  DictionaryContext *local_70;
  DictionaryContext *dict;
  undefined1 local_58 [8];
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  resourcesDictionaryIt;
  PDFDocumentCopyingContext *inCopyingContext_local;
  ObjectsContext *inObjectContext_local;
  PDFDictionary *inResourcesDictionary_local;
  PDFParser *inParser_local;
  PDFModifiedPage *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *formResourcesNames;
  
  resourcesDictionaryIt.
  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  .mCurrentPosition._M_node._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  PDFDictionary::GetIterator
            ((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              *)local_58,inResourcesDictionary);
  this_00 = PDFWriter::GetObjectsContext(this->mWriter);
  local_70 = ObjectsContext::StartDictionary(this_00);
  while (bVar2 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 ::MoveNext((ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                             *)local_58), pDVar1 = local_70, bVar2) {
    pPVar4 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
             ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                       *)local_58);
    psVar5 = PDFName::GetValue_abi_cxx11_(pPVar4);
    bVar2 = std::operator!=(psVar5,"XObject");
    pDVar1 = local_70;
    if (bVar2) {
      pPVar4 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                         *)local_58);
      psVar5 = PDFName::GetValue_abi_cxx11_(pPVar4);
      DictionaryContext::WriteKey(pDVar1,psVar5);
      pPVar6 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               ::GetValue((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                           *)local_58);
      PDFDocumentCopyingContext::CopyDirectObjectAsIs(inCopyingContext,pPVar6);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"XObject",(allocator<char> *)((long)&xobjectDict + 7));
  DictionaryContext::WriteKey(pDVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&xobjectDict + 7));
  existingXObjectDict.super_RefCountPtr<PDFDictionary>.mValue =
       (PDFDictionary *)ObjectsContext::StartDictionary(inObjectContext);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"XObject",
             (allocator<char> *)(imageObjectName.field_2._M_local_buf + 0xf));
  inPDFObject = PDFParser::QueryDictionaryObject(inParser,inResourcesDictionary,&local_d0);
  PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
            ((PDFObjectCastPtr<PDFDictionary> *)local_b0,inPDFObject);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)(imageObjectName.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string
            ((string *)
             &itExisting.
              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              .mCurrentPosition);
  pPVar3 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_b0);
  if (pPVar3 != (PDFDictionary *)0x0) {
    pPVar3 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_b0);
    PDFDictionary::GetIterator
              ((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                *)&i,pPVar3);
    name.field_2._8_8_ = 0;
    while (bVar2 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   ::MoveNext((ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                               *)&i), bVar2) {
      pPVar4 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                         *)&i);
      psVar5 = PDFName::GetValue_abi_cxx11_(pPVar4);
      std::__cxx11::string::string((string *)&itForms,(string *)psVar5);
      DictionaryContext::WriteKey
                ((DictionaryContext *)existingXObjectDict.super_RefCountPtr<PDFDictionary>.mValue,
                 (string *)&itForms);
      pPVar6 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               ::GetValue((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                           *)&i);
      PDFDocumentCopyingContext::CopyDirectObjectAsIs(inCopyingContext,pPVar6);
      uVar7 = std::__cxx11::string::length();
      if (uVar7 < name.field_2._8_8_ + 1) {
        inCharCode = '9';
      }
      else {
        puVar8 = (uchar *)std::__cxx11::string::operator[]((ulong)&itForms);
        inCharCode = *puVar8;
      }
      GetDifferentChar(this,inCharCode);
      std::__cxx11::string::push_back((char)&itExisting + '\x10');
      name.field_2._8_8_ = name.field_2._8_8_ + 1;
      std::__cxx11::string::~string((string *)&itForms);
    }
    ObjectsContext::EndLine(inObjectContext);
  }
  iStack_140 = std::vector<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>::begin
                         (&this->mContenxts);
  std::__cxx11::string::push_back((char)&itExisting + '\x10');
  local_144 = 0;
  while( true ) {
    formObjectName.field_2._8_8_ =
         std::vector<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>::end(&this->mContenxts);
    bVar2 = __gnu_cxx::operator!=
                      (&stack0xfffffffffffffec0,
                       (__normal_iterator<PDFFormXObject_**,_std::vector<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>_>
                        *)((long)&formObjectName.field_2 + 8));
    if (!bVar2) break;
    BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_>::BoxingBaseWithRW
              (&local_194,&local_144);
    BoxingBaseWithRW<int,STDStreamsReader<int>,STDStreamsWriter<int>>::ToString_abi_cxx11_
              (&local_190,&local_194);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &itExisting.
                    super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                    .mCurrentPosition,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    DictionaryContext::WriteKey
              ((DictionaryContext *)existingXObjectDict.super_RefCountPtr<PDFDictionary>.mValue,
               (string *)local_170);
    pPVar3 = existingXObjectDict.super_RefCountPtr<PDFDictionary>.mValue;
    ppPVar9 = __gnu_cxx::
              __normal_iterator<PDFFormXObject_**,_std::vector<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>_>
              ::operator*(&stack0xfffffffffffffec0);
    inObjectID = PDFFormXObject::GetObjectID(*ppPVar9);
    ObjectReference::ObjectReference(&local_1a8,inObjectID);
    DictionaryContext::WriteObjectReferenceValue((DictionaryContext *)pPVar3,&local_1a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_170);
    std::__cxx11::string::~string((string *)local_170);
    local_144 = local_144 + 1;
    __gnu_cxx::
    __normal_iterator<PDFFormXObject_**,_std::vector<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>_>
    ::operator++(&stack0xfffffffffffffec0);
  }
  ObjectsContext::EndDictionary
            (inObjectContext,
             (DictionaryContext *)existingXObjectDict.super_RefCountPtr<PDFDictionary>.mValue);
  ObjectsContext::EndDictionary(inObjectContext,local_70);
  resourcesDictionaryIt.
  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  .mCurrentPosition._M_node._7_1_ = 1;
  std::__cxx11::string::~string
            ((string *)
             &itExisting.
              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              .mCurrentPosition);
  PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFDictionary> *)local_b0);
  if ((resourcesDictionaryIt.
       super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
       .mCurrentPosition._M_node._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> PDFModifiedPage::WriteModifiedResourcesDict(PDFParser* inParser,PDFDictionary* inResourcesDictionary,ObjectsContext& inObjectContext,PDFDocumentCopyingContext* inCopyingContext)
{
	vector<string> formResourcesNames;

    MapIterator<PDFNameToPDFObjectMap>  resourcesDictionaryIt = inResourcesDictionary->GetIterator();
        
    // create modified page object
    DictionaryContext* dict = mWriter->GetObjectsContext().StartDictionary();
        
    // copy all elements of the page to the new page object, but the "Contents" and "Resources" elements
    while(resourcesDictionaryIt.MoveNext())
    {
        if(resourcesDictionaryIt.GetKey()->GetValue() != "XObject")
        {
            dict->WriteKey(resourcesDictionaryIt.GetKey()->GetValue());
            inCopyingContext->CopyDirectObjectAsIs(resourcesDictionaryIt.GetValue());
        }
    }   

    // now write a new xobject entry.
	dict->WriteKey("XObject");
	DictionaryContext* xobjectDict = inObjectContext.StartDictionary();

	PDFObjectCastPtr<PDFDictionary> existingXObjectDict(inParser->QueryDictionaryObject(inResourcesDictionary,"XObject"));
    string imageObjectName;
	if(existingXObjectDict.GetPtr())
	{
        // i'm having a very sophisticated algo here to create a new unique name. 
        // i'm making sure it's different in one letter from any name, using a well known discrete math proof method

		MapIterator<PDFNameToPDFObjectMap>  itExisting = existingXObjectDict->GetIterator();
		unsigned long i=0;
		while(itExisting.MoveNext())
		{
			string name = itExisting.GetKey()->GetValue();
			xobjectDict->WriteKey(name);
			inCopyingContext->CopyDirectObjectAsIs(itExisting.GetValue());
			imageObjectName.push_back((char)(GetDifferentChar((name.length() >= i+1) ? name[i]:0x39)));
			++i;
		}
		inObjectContext.EndLine();
	}

	PDFFormXObjectVector::iterator itForms = mContenxts.begin();
	imageObjectName.push_back('_');
	for(int i=0;itForms != mContenxts.end();++i,++itForms)
	{
		string formObjectName = imageObjectName + Int(i).ToString();
		xobjectDict->WriteKey(formObjectName);
		xobjectDict->WriteObjectReferenceValue((*itForms)->GetObjectID());
		formResourcesNames.push_back(formObjectName);
	}

	inObjectContext.EndDictionary(xobjectDict);
	inObjectContext.EndDictionary(dict);

	return formResourcesNames;
}